

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_GetFontBoundingBox(stbtt_fontinfo *info,int *x0,int *y0,int *x1,int *y1)

{
  uchar *puVar1;
  
  puVar1 = info->data;
  *x0 = (int)(short)((ushort)puVar1[(long)info->head + 0x24] << 8) |
        (uint)puVar1[(long)info->head + 0x25];
  *y0 = (int)(short)((ushort)puVar1[(long)info->head + 0x26] << 8) |
        (uint)puVar1[(long)info->head + 0x27];
  *x1 = (int)(short)((ushort)puVar1[(long)info->head + 0x28] << 8) |
        (uint)puVar1[(long)info->head + 0x29];
  *y1 = (int)(short)((ushort)puVar1[(long)info->head + 0x2a] << 8) |
        (uint)puVar1[(long)info->head + 0x2b];
  return;
}

Assistant:

STBTT_DEF void stbtt_GetFontBoundingBox(const stbtt_fontinfo *info, int *x0, int *y0, int *x1, int *y1)
{
   *x0 = ttSHORT(info->data + info->head + 36);
   *y0 = ttSHORT(info->data + info->head + 38);
   *x1 = ttSHORT(info->data + info->head + 40);
   *y1 = ttSHORT(info->data + info->head + 42);
}